

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O1

void __thiscall QStorageInfo::setPath(QStorageInfo *this,QString *path)

{
  QStorageInfoPrivate *pQVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  QStringView rhs;
  QStringView lhs;
  
  pQVar1 = (this->d).d.ptr;
  lVar2 = (pQVar1->rootPath).d.size;
  lVar3 = (path->d).size;
  if (lVar2 == lVar3) {
    rhs.m_data = (path->d).ptr;
    rhs.m_size = lVar3;
    lhs.m_data = (pQVar1->rootPath).d.ptr;
    lhs.m_size = lVar2;
    bVar4 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar4) {
      return;
    }
  }
  if ((pQVar1 != (QStorageInfoPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QStorageInfoPrivate>::detach_helper(&this->d);
  }
  QString::operator=(&((this->d).d.ptr)->rootPath,path);
  QStorageInfoPrivate::doStat((this->d).d.ptr);
  return;
}

Assistant:

void QStorageInfo::setPath(const QString &path)
{
    if (d->rootPath == path)
        return;
    d.detach();
    d->rootPath = path;
    d->doStat();
}